

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

void aead_do_encrypt_init(ptls_aead_context_t *_ctx,void *iv,void *aad,size_t aadlen)

{
  int local_38;
  int local_34;
  int blocklen;
  int ret;
  aead_crypto_context_t *ctx;
  size_t aadlen_local;
  void *aad_local;
  void *iv_local;
  ptls_aead_context_t *_ctx_local;
  
  _blocklen = _ctx;
  ctx = (aead_crypto_context_t *)aadlen;
  aadlen_local = (size_t)aad;
  aad_local = iv;
  iv_local = _ctx;
  local_34 = EVP_EncryptInit_ex((EVP_CIPHER_CTX *)_ctx[1].algo,(EVP_CIPHER *)0x0,(ENGINE *)0x0,
                                (uchar *)0x0,(uchar *)iv);
  if (local_34 == 0) {
    __assert_fail("ret",
                  "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/lib/openssl.c"
                  ,0x386,
                  "void aead_do_encrypt_init(ptls_aead_context_t *, const void *, const void *, size_t)"
                 );
  }
  if ((ctx != (aead_crypto_context_t *)0x0) &&
     (local_34 = EVP_EncryptUpdate((EVP_CIPHER_CTX *)_blocklen[1].algo,(uchar *)0x0,&local_38,
                                   (uchar *)aadlen_local,(int)ctx), local_34 == 0)) {
    __assert_fail("ret",
                  "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/lib/openssl.c"
                  ,0x38b,
                  "void aead_do_encrypt_init(ptls_aead_context_t *, const void *, const void *, size_t)"
                 );
  }
  return;
}

Assistant:

static void aead_do_encrypt_init(ptls_aead_context_t *_ctx, const void *iv, const void *aad, size_t aadlen)
{
    struct aead_crypto_context_t *ctx = (struct aead_crypto_context_t *)_ctx;
    int ret;

    /* FIXME for performance, preserve the expanded key instead of the raw key */
    ret = EVP_EncryptInit_ex(ctx->evp_ctx, NULL, NULL, NULL, iv);
    assert(ret);

    if (aadlen != 0) {
        int blocklen;
        ret = EVP_EncryptUpdate(ctx->evp_ctx, NULL, &blocklen, aad, (int)aadlen);
        assert(ret);
    }
}